

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_constants.h
# Opt level: O0

_Bool upb_FieldType_IsPackable(upb_FieldType field_type)

{
  uint kUnpackableTypes;
  upb_FieldType field_type_local;
  
  return (1 << ((byte)field_type & 0x1f) & 0xffffe1ffU) != 0;
}

Assistant:

UPB_INLINE bool upb_FieldType_IsPackable(upb_FieldType field_type) {
  // clang-format off
  const unsigned kUnpackableTypes =
      (1 << kUpb_FieldType_String) |
      (1 << kUpb_FieldType_Bytes) |
      (1 << kUpb_FieldType_Message) |
      (1 << kUpb_FieldType_Group);
  // clang-format on
  return (1 << field_type) & ~kUnpackableTypes;
}